

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::
UntypedPerformAction
          (FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestSuffixHandler<1>_> *pAVar1;
  Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> action;
  linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
  local_20;
  
  linked_ptr<testing::ActionInterface<TestSuffixHandler<1>(fmt::BasicStringRef<char>,mp::suf::Kind,int)>>
  ::
  copy<testing::ActionInterface<TestSuffixHandler<1>(fmt::BasicStringRef<char>,mp::suf::Kind,int)>>
            ((linked_ptr<testing::ActionInterface<TestSuffixHandler<1>(fmt::BasicStringRef<char>,mp::suf::Kind,int)>>
              *)&local_20,
             (linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
              *)untyped_action);
  pAVar1 = ActionResultHolder<TestSuffixHandler<1>>::
           PerformAction<TestSuffixHandler<1>(fmt::BasicStringRef<char>,mp::suf::Kind,int)>
                     ((Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
                       *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
  ::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }